

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entities.c
# Opt level: O1

xmlChar * xmlEncodeEntitiesInternal(xmlDocPtr doc,xmlChar *input,int attr)

{
  bool bVar1;
  xmlDocPtr pxVar2;
  byte *pbVar3;
  byte bVar4;
  byte bVar5;
  uint uVar6;
  byte *pbVar7;
  byte *pbVar8;
  char *pcVar9;
  xmlChar *pxVar10;
  int iVar11;
  long lVar12;
  byte *pbVar13;
  undefined8 unaff_R15;
  ulong uVar14;
  bool bVar15;
  char buf [11];
  byte local_4f;
  byte local_4e [9];
  undefined1 local_45;
  uint local_44;
  xmlDocPtr local_40;
  byte *local_38;
  
  if (input == (xmlChar *)0x0) {
LAB_0014634d:
    pbVar13 = (byte *)0x0;
  }
  else {
    if (doc == (xmlDocPtr)0x0) {
      uVar6 = 0;
    }
    else {
      uVar6 = (uint)CONCAT71((int7)((ulong)unaff_R15 >> 8),doc->type == XML_HTML_DOCUMENT_NODE);
    }
    pbVar7 = (byte *)(*xmlMalloc)(1000);
    if (pbVar7 == (byte *)0x0) {
      pbVar13 = (byte *)0x0;
      __xmlSimpleError(2,2,(xmlNodePtr)0x0,(char *)0x0,"xmlEncodeEntities: malloc failed");
    }
    else {
      pbVar13 = pbVar7;
      if (*input != '\0') {
        bVar4 = attr != 0 & (byte)uVar6;
        uVar14 = 1000;
        local_44 = uVar6;
        local_40 = doc;
        do {
          lVar12 = (long)pbVar7 - (long)pbVar13;
          if (uVar14 < lVar12 + 100U) {
            if ((long)uVar14 < 0) {
              iVar11 = 4;
              bVar1 = false;
            }
            else {
              pbVar8 = (byte *)(*xmlRealloc)(pbVar13,uVar14 * 2);
              bVar15 = pbVar8 == (byte *)0x0;
              if (!bVar15) {
                uVar14 = uVar14 * 2;
              }
              bVar1 = !bVar15;
              if (!bVar15) {
                pbVar13 = pbVar8;
              }
              iVar11 = (uint)bVar15 << 2;
            }
            if (bVar1) {
              pbVar7 = pbVar13 + lVar12;
              goto LAB_00145df8;
            }
          }
          else {
LAB_00145df8:
            bVar5 = *input;
            if (bVar5 == 0x26) {
              if (((bVar4 != 0) && (input[1] == 0x7b)) &&
                 (pcVar9 = strchr((char *)input,0x7d), pcVar9 != (char *)0x0)) {
                bVar5 = *input;
                if (bVar5 != 0x7d) {
                  do {
                    input = input + 1;
                    *pbVar7 = bVar5;
                    pbVar7 = pbVar7 + 1;
                    lVar12 = (long)pbVar7 - (long)pbVar13;
                    if (uVar14 < lVar12 + 100U) {
                      if ((long)uVar14 < 0) {
                        iVar11 = 4;
                        bVar1 = false;
                      }
                      else {
                        pbVar8 = (byte *)(*xmlRealloc)(pbVar13,uVar14 * 2);
                        bVar15 = pbVar8 == (byte *)0x0;
                        if (!bVar15) {
                          uVar14 = uVar14 * 2;
                        }
                        bVar1 = !bVar15;
                        if (!bVar15) {
                          pbVar13 = pbVar8;
                        }
                        iVar11 = (uint)bVar15 << 2;
                      }
                      if (!bVar1) goto LAB_00145ff4;
                      pbVar7 = pbVar13 + lVar12;
                    }
                    bVar5 = *input;
                  } while (bVar5 != 0x7d);
                  bVar5 = 0x7d;
                }
                *pbVar7 = bVar5;
                pbVar7 = pbVar7 + 1;
LAB_0014616e:
                input = input + 1;
                iVar11 = 2;
                goto LAB_00145ff4;
              }
              pbVar7[0] = 0x26;
              pbVar7[1] = 0x61;
              pbVar7[2] = 0x6d;
              pbVar7[3] = 0x70;
              pbVar7[4] = 0x3b;
              pbVar7 = pbVar7 + 5;
            }
            else if (bVar5 == 0x3e) {
              pbVar7[0] = 0x26;
              pbVar7[1] = 0x67;
              pbVar7[2] = 0x74;
              pbVar7[3] = 0x3b;
              pbVar7 = pbVar7 + 4;
            }
            else {
              uVar6 = (uint)bVar5;
              if (uVar6 == 0x3c) {
                if ((((bVar4 == 0) || (input[1] != 0x21)) || (input[2] != 0x2d)) ||
                   ((input[3] != 0x2d || (pbVar8 = xmlStrstr(input,"-->"), pbVar8 == (byte *)0x0))))
                {
                  pbVar7[0] = 0x26;
                  pbVar7[1] = 0x6c;
                  pbVar7[2] = 0x74;
                  pbVar7[3] = 0x3b;
                  pbVar7 = pbVar7 + 4;
                  iVar11 = 0;
                }
                else {
                  pbVar3 = pbVar8;
                  if (input != pbVar8) {
                    do {
                      local_38 = pbVar3;
                      bVar5 = *input;
                      input = input + 1;
                      *pbVar7 = bVar5;
                      pbVar7 = pbVar7 + 1;
                      lVar12 = (long)pbVar7 - (long)pbVar13;
                      if (uVar14 < lVar12 + 100U) {
                        if ((long)uVar14 < 0) {
                          iVar11 = 4;
                          bVar1 = false;
                        }
                        else {
                          pbVar8 = (byte *)(*xmlRealloc)(pbVar13,uVar14 * 2);
                          bVar15 = pbVar8 == (byte *)0x0;
                          if (!bVar15) {
                            uVar14 = uVar14 * 2;
                          }
                          bVar1 = !bVar15;
                          if (!bVar15) {
                            pbVar13 = pbVar8;
                          }
                          iVar11 = (uint)bVar15 << 2;
                          pbVar8 = local_38;
                        }
                        if (!bVar1) goto LAB_00145fdb;
                        pbVar7 = pbVar13 + lVar12;
                      }
                      pbVar3 = local_38;
                    } while (input != pbVar8);
                  }
                  *pbVar7 = *input;
                  pbVar7[1] = input[1];
                  pbVar8 = input + 2;
                  input = input + 3;
                  pbVar7[2] = *pbVar8;
                  pbVar7 = pbVar7 + 3;
                  iVar11 = 2;
                }
LAB_00145fdb:
                if (iVar11 != 0) goto LAB_00145ff4;
              }
              else {
                if (('\x1f' < (char)bVar5) ||
                   ((byte)(bVar5 == 0xd & (byte)local_44 | (byte)(bVar5 - 9) < 2) == 1))
                goto LAB_00145fc8;
                if ((char)bVar5 < '\0') {
                  if (local_40 == (xmlDocPtr)0x0) {
                    if ((byte)local_44 == 0) goto LAB_001460f9;
                  }
                  else if (local_40->encoding == (xmlChar *)0x0 && (local_44 & 1) == 0) {
LAB_001460f9:
                    __xmlSimpleError(2,0x13a8,(xmlNodePtr)0x0,"xmlEncodeEntities: input not UTF-8",
                                     (char *)0x0);
                    pxVar2 = local_40;
                    if (local_40 != (xmlDocPtr)0x0) {
                      pxVar10 = xmlStrdup((xmlChar *)"ISO-8859-1");
                      pxVar2->encoding = pxVar10;
                    }
                    snprintf((char *)&local_4f,0xb,"&#%d;",(ulong)*input);
                    local_45 = 0;
                    if (local_4f != 0) {
                      pbVar8 = local_4e;
                      bVar5 = local_4f;
                      do {
                        *pbVar7 = bVar5;
                        pbVar7 = pbVar7 + 1;
                        bVar5 = *pbVar8;
                        pbVar8 = pbVar8 + 1;
                      } while (bVar5 != 0);
                    }
                    goto LAB_0014616e;
                  }
LAB_00145fc8:
                  *pbVar7 = bVar5;
                  pbVar7 = pbVar7 + 1;
                }
                else if ((0x1f < bVar5) || ((uVar6 < 0xe && ((0x2600U >> (uVar6 & 0x1f) & 1) != 0)))
                        ) {
                  snprintf((char *)&local_4f,0xb,"&#%d;");
                  local_45 = 0;
                  if (local_4f != 0) {
                    pbVar8 = local_4e;
                    bVar5 = local_4f;
                    do {
                      *pbVar7 = bVar5;
                      pbVar7 = pbVar7 + 1;
                      bVar5 = *pbVar8;
                      pbVar8 = pbVar8 + 1;
                    } while (bVar5 != 0);
                  }
                }
              }
            }
            input = input + 1;
            iVar11 = 0;
          }
LAB_00145ff4:
          if ((iVar11 != 0) && (iVar11 != 2)) {
            if (iVar11 != 4) {
              return pbVar13;
            }
            __xmlSimpleError(2,2,(xmlNodePtr)0x0,(char *)0x0,"xmlEncodeEntities: realloc failed");
            (*xmlFree)(pbVar13);
            goto LAB_0014634d;
          }
        } while (*input != 0);
      }
      *pbVar7 = 0;
    }
  }
  return pbVar13;
}

Assistant:

static xmlChar *
xmlEncodeEntitiesInternal(xmlDocPtr doc, const xmlChar *input, int attr) {
    const xmlChar *cur = input;
    xmlChar *buffer = NULL;
    xmlChar *out = NULL;
    size_t buffer_size = 0;
    int html = 0;

    if (input == NULL) return(NULL);
    if (doc != NULL)
        html = (doc->type == XML_HTML_DOCUMENT_NODE);

    /*
     * allocate an translation buffer.
     */
    buffer_size = 1000;
    buffer = (xmlChar *) xmlMalloc(buffer_size);
    if (buffer == NULL) {
        xmlEntitiesErrMemory("xmlEncodeEntities: malloc failed");
	return(NULL);
    }
    out = buffer;

    while (*cur != '\0') {
        size_t indx = out - buffer;
        if (indx + 100 > buffer_size) {

	    growBufferReentrant();
	    out = &buffer[indx];
	}

	/*
	 * By default one have to encode at least '<', '>', '"' and '&' !
	 */
	if (*cur == '<') {
	    const xmlChar *end;

	    /*
	     * Special handling of server side include in HTML attributes
	     */
	    if (html && attr &&
	        (cur[1] == '!') && (cur[2] == '-') && (cur[3] == '-') &&
	        ((end = xmlStrstr(cur, BAD_CAST "-->")) != NULL)) {
	        while (cur != end) {
		    *out++ = *cur++;
		    indx = out - buffer;
		    if (indx + 100 > buffer_size) {
			growBufferReentrant();
			out = &buffer[indx];
		    }
		}
		*out++ = *cur++;
		*out++ = *cur++;
		*out++ = *cur++;
		continue;
	    }
	    *out++ = '&';
	    *out++ = 'l';
	    *out++ = 't';
	    *out++ = ';';
	} else if (*cur == '>') {
	    *out++ = '&';
	    *out++ = 'g';
	    *out++ = 't';
	    *out++ = ';';
	} else if (*cur == '&') {
	    /*
	     * Special handling of &{...} construct from HTML 4, see
	     * http://www.w3.org/TR/html401/appendix/notes.html#h-B.7.1
	     */
	    if (html && attr && (cur[1] == '{') &&
	        (strchr((const char *) cur, '}'))) {
	        while (*cur != '}') {
		    *out++ = *cur++;
		    indx = out - buffer;
		    if (indx + 100 > buffer_size) {
			growBufferReentrant();
			out = &buffer[indx];
		    }
		}
		*out++ = *cur++;
		continue;
	    }
	    *out++ = '&';
	    *out++ = 'a';
	    *out++ = 'm';
	    *out++ = 'p';
	    *out++ = ';';
	} else if (((*cur >= 0x20) && (*cur < 0x80)) ||
	    (*cur == '\n') || (*cur == '\t') || ((html) && (*cur == '\r'))) {
	    /*
	     * default case, just copy !
	     */
	    *out++ = *cur;
	} else if (*cur >= 0x80) {
	    if (((doc != NULL) && (doc->encoding != NULL)) || (html)) {
		/*
		 * Bjørn Reese <br@sseusa.com> provided the patch
	        xmlChar xc;
	        xc = (*cur & 0x3F) << 6;
	        if (cur[1] != 0) {
		    xc += *(++cur) & 0x3F;
		    *out++ = xc;
	        } else
		 */
		*out++ = *cur;
	    } else {
		/*
		 * We assume we have UTF-8 input.
		 * It must match either:
		 *   110xxxxx 10xxxxxx
		 *   1110xxxx 10xxxxxx 10xxxxxx
		 *   11110xxx 10xxxxxx 10xxxxxx 10xxxxxx
		 * That is:
		 *   cur[0] is 11xxxxxx
		 *   cur[1] is 10xxxxxx
		 *   cur[2] is 10xxxxxx if cur[0] is 111xxxxx
		 *   cur[3] is 10xxxxxx if cur[0] is 1111xxxx
		 *   cur[0] is not 11111xxx
		 */
		char buf[11], *ptr;
		int val = 0, l = 1;

		if (((cur[0] & 0xC0) != 0xC0) ||
		    ((cur[1] & 0xC0) != 0x80) ||
		    (((cur[0] & 0xE0) == 0xE0) && ((cur[2] & 0xC0) != 0x80)) ||
		    (((cur[0] & 0xF0) == 0xF0) && ((cur[3] & 0xC0) != 0x80)) ||
		    (((cur[0] & 0xF8) == 0xF8))) {
		    xmlEntitiesErr(XML_CHECK_NOT_UTF8,
			    "xmlEncodeEntities: input not UTF-8");
		    if (doc != NULL)
			doc->encoding = xmlStrdup(BAD_CAST "ISO-8859-1");
		    snprintf(buf, sizeof(buf), "&#%d;", *cur);
		    buf[sizeof(buf) - 1] = 0;
		    ptr = buf;
		    while (*ptr != 0) *out++ = *ptr++;
		    cur++;
		    continue;
		} else if (*cur < 0xE0) {
                    val = (cur[0]) & 0x1F;
		    val <<= 6;
		    val |= (cur[1]) & 0x3F;
		    l = 2;
		} else if (*cur < 0xF0) {
                    val = (cur[0]) & 0x0F;
		    val <<= 6;
		    val |= (cur[1]) & 0x3F;
		    val <<= 6;
		    val |= (cur[2]) & 0x3F;
		    l = 3;
		} else if (*cur < 0xF8) {
                    val = (cur[0]) & 0x07;
		    val <<= 6;
		    val |= (cur[1]) & 0x3F;
		    val <<= 6;
		    val |= (cur[2]) & 0x3F;
		    val <<= 6;
		    val |= (cur[3]) & 0x3F;
		    l = 4;
		}
		if ((l == 1) || (!IS_CHAR(val))) {
		    xmlEntitiesErr(XML_ERR_INVALID_CHAR,
			"xmlEncodeEntities: char out of range\n");
		    if (doc != NULL)
			doc->encoding = xmlStrdup(BAD_CAST "ISO-8859-1");
		    snprintf(buf, sizeof(buf), "&#%d;", *cur);
		    buf[sizeof(buf) - 1] = 0;
		    ptr = buf;
		    while (*ptr != 0) *out++ = *ptr++;
		    cur++;
		    continue;
		}
		/*
		 * We could do multiple things here. Just save as a char ref
		 */
		snprintf(buf, sizeof(buf), "&#x%X;", val);
		buf[sizeof(buf) - 1] = 0;
		ptr = buf;
		while (*ptr != 0) *out++ = *ptr++;
		cur += l;
		continue;
	    }
	} else if (IS_BYTE_CHAR(*cur)) {
	    char buf[11], *ptr;

	    snprintf(buf, sizeof(buf), "&#%d;", *cur);
	    buf[sizeof(buf) - 1] = 0;
            ptr = buf;
	    while (*ptr != 0) *out++ = *ptr++;
	}
	cur++;
    }
    *out = 0;
    return(buffer);

mem_error:
    xmlEntitiesErrMemory("xmlEncodeEntities: realloc failed");
    xmlFree(buffer);
    return(NULL);
}